

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mimics_pcre.cc
# Opt level: O0

bool __thiscall re2::EmptyStringWalker::ShortVisit(EmptyStringWalker *this,Regexp *re,bool a)

{
  ostream *poVar1;
  LogMessage local_1a0;
  byte local_19;
  Regexp *pRStack_18;
  bool a_local;
  Regexp *re_local;
  EmptyStringWalker *this_local;
  
  local_19 = a;
  pRStack_18 = re;
  re_local = (Regexp *)this;
  LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_1a0,
             "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/mimics_pcre.cc",
             0x7a);
  poVar1 = LogMessage::stream(&local_1a0);
  std::operator<<(poVar1,"EmptyStringWalker::ShortVisit called");
  LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1a0);
  return (bool)(local_19 & 1);
}

Assistant:

bool ShortVisit(Regexp* re, bool a) {
    // Should never be called: we use Walk not WalkExponential.
    LOG(DFATAL) << "EmptyStringWalker::ShortVisit called";
    return a;
  }